

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.C
# Opt level: O0

StringList * __thiscall
Config::values(StringList *__return_storage_ptr__,Config *this,string *section)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  string *section_local;
  Config *this_local;
  
  it._M_node = (_Base_ptr)section;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>_>_>_>
       ::find(&this->_sections,section);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>_>_>_>
       ::end(&this->_sections);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::__cxx11::list<String,_std::allocator<String>_>::list(__return_storage_ptr__);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<String,_std::allocator<String>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::list<String,_std::allocator<String>_>::list
              (__return_storage_ptr__,&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

StringList Config::values(std::string const & section) const
{
    SectionsMap::const_iterator it = _sections.find(section);
    if (it == _sections.end()) {
        return StringList();
    }
    return it->second;
}